

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O3

void incdec_verify::PostDecTestInt64(void)

{
  bool expected;
  long t;
  long lVar1;
  string local_50;
  
  lVar1 = 0x10;
  do {
    t = *(long *)(&UNK_0014dc60 + lVar1);
    expected = *(bool *)((long)&dec_int64 + lVar1);
    if (expected != true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case dec_int64 throw (2): ","",-t);
      err_msg<long>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1a8);
  return;
}

Assistant:

void PostDecTestInt64()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int64_t > si(dec_int64[i].x);
			SafeInt< std::int64_t > vv = si--;

			if(vv != dec_int64[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int64[i].fExpected )
		{
			err_msg( "Error in case dec_int64 throw (2): ", dec_int64[i].x, dec_int64[i].fExpected );
		}
	}
}